

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uptime.cpp
# Opt level: O2

string * uptime_abi_cxx11_(void)

{
  char *pcVar1;
  int iVar2;
  string *in_RDI;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  double uptime;
  ifstream infile;
  byte abStack_200 [488];
  
  std::ifstream::ifstream(&infile,"/proc/uptime",_S_in);
  if ((abStack_200[*(long *)(_infile + -0x18)] & 5) == 0) {
    std::istream::_M_extract<double>((double *)&infile);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    iVar2 = (int)(uptime / 86400.0);
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    if (iVar2 != 0) {
      std::__cxx11::to_string(&local_268,iVar2);
      std::operator+(&local_248,&local_268,"day");
      pcVar1 = " ";
      if (1 < iVar2) {
        pcVar1 = "s ";
      }
      std::operator+(&local_288,&local_248,pcVar1);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
    }
    dVar3 = uptime - (double)(iVar2 * 0x15180);
    iVar2 = (int)(dVar3 / 3600.0);
    if (iVar2 != 0) {
      std::__cxx11::to_string(&local_268,iVar2);
      std::operator+(&local_248,&local_268,"hour");
      pcVar1 = " ";
      if (1 < iVar2) {
        pcVar1 = "s ";
      }
      std::operator+(&local_288,&local_248,pcVar1);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
    }
    dVar3 = dVar3 - (double)(iVar2 * 0xe10);
    iVar2 = (int)(dVar3 / 60.0);
    if (iVar2 != 0) {
      std::__cxx11::to_string(&local_268,iVar2);
      std::operator+(&local_248,&local_268,"min");
      pcVar1 = " ";
      if (1 < iVar2) {
        pcVar1 = "s ";
      }
      std::operator+(&local_288,&local_248,pcVar1);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
    }
    iVar2 = (int)(dVar3 - (double)(iVar2 * 0x3c));
    if (iVar2 != 0) {
      std::__cxx11::to_string(&local_268,iVar2);
      std::operator+(&local_248,&local_268,"sec");
      pcVar1 = "";
      if (1 < iVar2) {
        pcVar1 = "s";
      }
      std::operator+(&local_288,&local_248,pcVar1);
      std::__cxx11::string::append((string *)in_RDI);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,"Unknown",(allocator<char> *)&local_288);
  }
  std::ifstream::~ifstream(&infile);
  return in_RDI;
}

Assistant:

std::string uptime() {
  std::ifstream infile("/proc/uptime");
  if (!infile) {
    return "Unknown";
  }

  double uptime;
  infile >> uptime;

  int days = static_cast<int>(uptime / 86400);
  int hours = static_cast<int>((uptime - days * 86400) / 3600);
  int mins = static_cast<int>((uptime - days * 86400 - hours * 3600) / 60);
  int secs = static_cast<int>(uptime - days * 86400 - hours * 3600 - mins * 60);

  std::string output;

  if (days) {
    output += std::to_string(days) + "day" + (days > 1 ? "s " : " ");
  }

  if (hours) {
    output += std::to_string(hours) + "hour" + (hours > 1 ? "s " : " ");
  }

  if (mins) {
    output += std::to_string(mins) + "min" + (mins > 1 ? "s " : " ");
  }

  if (secs) {
    output += std::to_string(secs) + "sec" + (secs > 1 ? "s" : "");
  }

  return output;
}